

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O0

FT_Long FT_MulDiv_No_Round(FT_Long a_,FT_Long b_,FT_Long c_)

{
  undefined8 local_60;
  undefined8 local_58;
  FT_Long d_;
  FT_UInt64 d;
  FT_UInt64 c;
  FT_UInt64 b;
  FT_UInt64 a;
  FT_Int s;
  FT_Long c__local;
  FT_Long b__local;
  FT_Long a__local;
  
  a._4_4_ = 1;
  b = a_;
  if (a_ < 0) {
    b = -a_;
    a._4_4_ = -1;
  }
  c = b_;
  if (b_ < 0) {
    c = -b_;
    a._4_4_ = -a._4_4_;
  }
  d = c_;
  if (c_ < 0) {
    d = -c_;
    a._4_4_ = -a._4_4_;
  }
  if (d == 0) {
    local_58 = 0x7fffffff;
  }
  else {
    local_58 = (b * c) / d;
  }
  if (a._4_4_ < 0) {
    local_60 = -local_58;
  }
  else {
    local_60 = local_58;
  }
  return local_60;
}

Assistant:

FT_BASE_DEF( FT_Long )
  FT_MulDiv_No_Round( FT_Long  a_,
                      FT_Long  b_,
                      FT_Long  c_ )
  {
    FT_Int     s = 1;
    FT_UInt64  a, b, c, d;
    FT_Long    d_;


    a = (FT_UInt64)a_;
    b = (FT_UInt64)b_;
    c = (FT_UInt64)c_;

    FT_MOVE_SIGN( a_, a, s );
    FT_MOVE_SIGN( b_, b, s );
    FT_MOVE_SIGN( c_, c, s );

    d = c > 0 ? a * b / c
              : 0x7FFFFFFFUL;

    d_ = (FT_Long)d;

    return s < 0 ? NEG_LONG( d_ ) : d_;
  }